

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O3

size_t __thiscall Diligent::PipelineStateVkImpl::ShaderStageInfo::Count(ShaderStageInfo *this)

{
  size_t sVar1;
  char (*Args_1) [32];
  string msg;
  string local_30;
  
  sVar1 = (long)(this->Shaders).
                super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->Shaders).
                super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  Args_1 = (char (*) [32])
           ((long)(this->SPIRVs).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->SPIRVs).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (sVar1 != (long)Args_1 * -0x5555555555555555) {
    FormatString<char[26],char[32]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Shaders.size() == SPIRVs.size()",Args_1);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"Count",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x24b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    sVar1 = (long)(this->Shaders).
                  super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->Shaders).
                  super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  return sVar1;
}

Assistant:

PipelineStateVkImpl::PipelineStateVkImpl(IReferenceCounters* pRefCounters, RenderDeviceVkImpl* pDeviceVk, const RayTracingPipelineStateCreateInfo& CreateInfo) :
    TPipelineStateBase{pRefCounters, pDeviceVk, CreateInfo}
{
    Construct<ShaderVkImpl>(CreateInfo);
}